

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix2 * matrix2_multiply(matrix2 *self,matrix2 *mT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (self->field_0).m[2];
  dVar2 = (mT->field_0).m[0];
  dVar3 = (mT->field_0).m[1];
  dVar4 = (self->field_0).m[0];
  dVar5 = (self->field_0).m[1];
  dVar6 = (self->field_0).m[3];
  dVar7 = (mT->field_0).m[2];
  dVar8 = (mT->field_0).m[3];
  (self->field_0).m[0] = dVar4 * dVar2 + dVar1 * dVar3;
  (self->field_0).m[1] = dVar2 * dVar5 + dVar3 * dVar6;
  (self->field_0).m[2] = dVar4 * dVar7 + dVar1 * dVar8;
  (self->field_0).m[3] = dVar5 * dVar7 + dVar6 * dVar8;
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_multiply(struct matrix2 *self, const struct matrix2 *mT)
{
	/* mT is the multiplicand */

	struct matrix2 r;

	matrix2_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11;

	matrix2_set(self, &r); /* overwrite/save it */

	return self;
}